

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIFont::~CGUIFont(CGUIFont *this,void **vtt)

{
  void *pvVar1;
  IVideoDriver *pIVar2;
  IGUISpriteBank *pIVar3;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[5];
  pIVar2 = this->Driver;
  if (pIVar2 != (IVideoDriver *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar2->_vptr_IVideoDriver + (long)pIVar2->_vptr_IVideoDriver[-3]));
  }
  pIVar3 = this->SpriteBank;
  if (pIVar3 != (IGUISpriteBank *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar3->_vptr_IGUISpriteBank + (long)pIVar3->_vptr_IGUISpriteBank[-3]));
  }
  ::std::__cxx11::wstring::_M_dispose();
  ::std::
  _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
  ::~_Rb_tree(&(this->CharacterMap)._M_t);
  ::std::_Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
  ::~_Vector_base((_Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
                   *)&this->Areas);
  return;
}

Assistant:

CGUIFont::~CGUIFont()
{
	if (Driver)
		Driver->drop();

	if (SpriteBank) {
		SpriteBank->drop();
		// TODO: spritebank still exists in gui-environment and should be removed here when it's
		// reference-count is 1. Just can't do that from here at the moment.
		// But spritebank would not be able to drop textures anyway because those are in texture-cache
		// where they can't be removed unless materials start reference-couting 'em.
	}
}